

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_undo.c
# Opt level: O1

int canvas_undo_isdirty(_glist *x)

{
  int iVar1;
  _glist *p_Var2;
  
  iVar1 = 0;
  if (x == (_glist *)0x0) {
    p_Var2 = (_glist *)0x0;
  }
  else {
    p_Var2 = (_glist *)canvas_undo_get(x);
  }
  if ((p_Var2 != (_glist *)0x0) &&
     (iVar1 = 1, (_binbuf *)(p_Var2->gl_obj).te_g.g_next == (p_Var2->gl_obj).te_binbuf)) {
    p_Var2 = canvas_getrootfor(p_Var2);
    iVar1 = canvas_undo_doisdirty(p_Var2);
    return iVar1;
  }
  return iVar1;
}

Assistant:

static int canvas_undo_isdirty(t_canvas *x)
{
    t_undo *udo = x?canvas_undo_get(x):0;
    return (0 != udo)
        && ((udo->u_last != udo->u_cleanstate)
            || canvas_undo_doisdirty(canvas_getrootfor(x)));
}